

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

FString __thiscall FString::operator+(FString *this,FString *tail)

{
  uint uVar1;
  FStringData *pFVar2;
  long *in_RDX;
  size_t strlen;
  ulong uVar3;
  void *__dest;
  
  uVar1 = *(uint *)(tail->Chars + -0xc);
  strlen = (ulong)*(uint *)(*in_RDX + -0xc) + (ulong)uVar1;
  pFVar2 = FStringData::Alloc(strlen);
  this->Chars = (char *)(pFVar2 + 1);
  pFVar2->Len = (uint)strlen;
  uVar3 = (ulong)*(uint *)(tail->Chars + -0xc);
  memcpy(pFVar2 + 1,tail->Chars,uVar3);
  *(undefined1 *)((long)&pFVar2[1].Len + uVar3) = 0;
  __dest = (void *)((long)&pFVar2[1].Len + (ulong)uVar1);
  uVar3 = (ulong)*(uint *)(*in_RDX + -0xc);
  memcpy(__dest,(void *)*in_RDX,uVar3);
  *(undefined1 *)(uVar3 + (long)__dest) = 0;
  return (FString)(char *)this;
}

Assistant:

FString FString::operator + (const FString &tail) const
{
	return FString (*this, tail);
}